

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef expr,char *catchTag)

{
  size_t this;
  bool bVar1;
  string_view local_40;
  size_t local_30;
  size_t index;
  ArenaVector<wasm::Name> *list;
  Expression *expression;
  char *catchTag_local;
  BinaryenExpressionRef expr_local;
  
  list = (ArenaVector<wasm::Name> *)expr;
  expression = (Expression *)catchTag;
  catchTag_local = (char *)expr;
  bVar1 = wasm::Expression::is<wasm::Try>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xe9d,
                  "BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef, const char *)");
  }
  if (expression != (Expression *)0x0) {
    index = (size_t)&list[1].super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
    local_30 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                         ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)index);
    this = index;
    wasm::Name::Name((Name *)&local_40,(char *)expression);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)this,(Name)local_40);
    return (BinaryenIndex)local_30;
  }
  __assert_fail("catchTag",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xe9e,
                "BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef, const char *)");
}

Assistant:

BinaryenIndex BinaryenTryAppendCatchTag(BinaryenExpressionRef expr,
                                        const char* catchTag) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(catchTag);
  auto& list = static_cast<Try*>(expression)->catchTags;
  auto index = list.size();
  list.push_back(catchTag);
  return index;
}